

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

void Aig_ManCounterExampleValueStart(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  void *pvVar7;
  uint uVar8;
  ulong uVar9;
  void *pvVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  uint local_68;
  
  local_68 = pAig->nRegs;
  if ((int)local_68 < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x532,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
  }
  if (pAig->pData2 != (void *)0x0) {
    __assert_fail("pAig->pData2 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x533,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
  }
  uVar9 = (ulong)local_68;
  iVar2 = pCex->iFrame;
  pVVar4 = pAig->vObjs;
  iVar3 = pVVar4->nSize;
  uVar8 = (iVar2 + 1) * iVar3;
  pvVar10 = calloc((long)(int)((((int)uVar8 >> 5) + 1) - (uint)((uVar8 & 0x1f) == 0)),4);
  pAig->pData2 = pvVar10;
  uVar8 = 0;
  do {
    if ((pAig->nTruePis < 0) || (pAig->vCis->nSize <= (int)(pAig->nTruePis + uVar8)))
    goto LAB_006df171;
    if (((uint)(&pCex[1].iPo)[uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0) {
      __assert_fail("Abc_InfoHasBit(pCex->pData, iBit++) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                    ,0x538,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
    }
    uVar8 = uVar8 + 1;
  } while (local_68 != uVar8);
  if (-1 < iVar2) {
    uVar8 = pAig->nTruePis;
    iVar22 = 0;
    uVar14 = 0;
    uVar21 = uVar9;
    if (0 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
    }
    do {
      iVar15 = iVar22 * iVar3;
      puVar1 = (uint *)((long)pvVar10 + (long)(iVar15 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)iVar15 & 0x1f);
      uVar20 = (uint)uVar21;
      local_68 = uVar20;
      if (0 < (int)uVar8) {
        pVVar5 = pAig->vCis;
        local_68 = uVar8 + uVar20;
        uVar17 = 0;
        do {
          if ((long)pVVar5->nSize <= (long)uVar17) goto LAB_006df171;
          uVar11 = uVar20 + (int)uVar17;
          if (((uint)(&pCex[1].iPo)[(int)uVar11 >> 5] >> (uVar11 & 0x1f) & 1) != 0) {
            iVar12 = *(int *)((long)pVVar5->pArray[uVar17] + 0x24) + iVar15;
            puVar1 = (uint *)((long)pvVar10 + (long)(iVar12 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)iVar12 & 0x1f);
          }
          uVar17 = uVar17 + 1;
        } while (uVar8 != uVar17);
      }
      iVar12 = pVVar4->nSize;
      if (0 < iVar12) {
        ppvVar6 = pVVar4->pArray;
        lVar18 = 0;
        do {
          pvVar7 = ppvVar6[lVar18];
          if ((pvVar7 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar7 + 0x18) & 7) - 7)) {
            uVar17 = *(ulong *)((long)pvVar7 + 8);
            iVar16 = -1;
            iVar13 = -1;
            if (uVar17 != 0) {
              iVar13 = *(int *)((uVar17 & 0xfffffffffffffffe) + 0x24);
            }
            uVar23 = *(ulong *)((long)pvVar7 + 0x10);
            if (uVar23 != 0) {
              iVar16 = *(int *)((uVar23 & 0xfffffffffffffffe) + 0x24);
            }
            if ((((uint)uVar23 ^
                 *(uint *)((long)pvVar10 + (long)(iVar16 + iVar15 >> 5) * 4) >>
                 ((byte)(iVar16 + iVar15) & 0x1f)) &
                 (*(uint *)((long)pvVar10 + (long)(iVar13 + iVar15 >> 5) * 4) >>
                  ((byte)(iVar13 + iVar15) & 0x1f) ^ (uint)uVar17) & 1) != 0) {
              iVar12 = *(int *)((long)pvVar7 + 0x24) + iVar15;
              puVar1 = (uint *)((long)pvVar10 + (long)(iVar12 >> 5) * 4);
              *puVar1 = *puVar1 | 1 << ((byte)iVar12 & 0x1f);
              iVar12 = pVVar4->nSize;
            }
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < iVar12);
      }
      pVVar5 = pAig->vCos;
      iVar12 = pVVar5->nSize;
      if (0 < iVar12) {
        ppvVar6 = pVVar5->pArray;
        lVar18 = 0;
        do {
          uVar17 = *(ulong *)((long)ppvVar6[lVar18] + 8);
          if (uVar17 == 0) {
            iVar13 = -1;
          }
          else {
            iVar13 = *(int *)((uVar17 & 0xfffffffffffffffe) + 0x24);
          }
          if ((((uint)uVar17 ^
               *(uint *)((long)pvVar10 + (long)(iVar13 + iVar15 >> 5) * 4) >>
               ((byte)(iVar13 + iVar15) & 0x1f)) & 1) != 0) {
            iVar12 = *(int *)((long)ppvVar6[lVar18] + 0x24) + iVar15;
            puVar1 = (uint *)((long)pvVar10 + (long)(iVar12 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)iVar12 & 0x1f);
            iVar12 = pVVar5->nSize;
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < iVar12);
      }
      if (iVar22 != iVar2) {
        uVar20 = pAig->nTruePos;
        uVar19 = (ulong)uVar20;
        uVar17 = (ulong)uVar8;
        uVar23 = uVar9;
        do {
          if (((((int)uVar20 < 0) || (pVVar5->nSize <= (int)uVar19)) || ((int)uVar17 < 0)) ||
             (pAig->vCis->nSize <= (int)uVar17)) goto LAB_006df171;
          uVar11 = *(int *)((long)pVVar5->pArray[uVar19] + 0x24) + iVar15;
          if ((*(uint *)((long)pvVar10 + (long)((int)uVar11 >> 5) * 4) >> (uVar11 & 0x1f) & 1) != 0)
          {
            iVar12 = *(int *)((long)pAig->vCis->pArray[uVar17] + 0x24) + (iVar22 + 1) * iVar3;
            puVar1 = (uint *)((long)pvVar10 + (long)(iVar12 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)iVar12 & 0x1f);
          }
          uVar19 = uVar19 + 1;
          uVar17 = uVar17 + 1;
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
      bVar24 = iVar22 != iVar2;
      uVar21 = uVar21 + uVar14;
      iVar22 = iVar22 + 1;
    } while (bVar24);
  }
  if (local_68 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x559,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
  }
  iVar22 = pCex->iPo;
  if ((-1 < (long)iVar22) && (iVar22 < pAig->vCos->nSize)) {
    uVar8 = iVar2 * iVar3 + *(int *)((long)pAig->vCos->pArray[iVar22] + 0x24);
    if ((*(uint *)((long)pvVar10 + (long)((int)uVar8 >> 5) * 4) >> (uVar8 & 0x1f) & 1) == 0) {
      __assert_fail("Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * pCex->iFrame + Aig_ObjId(Aig_ManCo(pAig, pCex->iPo)) )"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                    ,0x55b,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
    }
    return;
  }
LAB_006df171:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Aig_ManCounterExampleValueStart( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int Val0, Val1, nObjs, i, k, iBit = 0;
    assert( Aig_ManRegNum(pAig) > 0 ); // makes sense only for sequential AIGs
    assert( pAig->pData2 == NULL );    // if this fail, there may be a memory leak
    // allocate memory to store simulation bits for internal nodes
    pAig->pData2 = ABC_CALLOC( unsigned, Abc_BitWordNum( (pCex->iFrame + 1) * Aig_ManObjNumMax(pAig) ) );
    // the register values in the counter-example should be zero
    Saig_ManForEachLo( pAig, pObj, k )
        assert( Abc_InfoHasBit(pCex->pData, iBit++) == 0 );
    // iterate through the timeframes
    nObjs = Aig_ManObjNumMax(pAig);
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        // set constant 1 node
        Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + 0 );
        // set primary inputs according to the counter-example
        Saig_ManForEachPi( pAig, pObj, k )
            if ( Abc_InfoHasBit(pCex->pData, iBit++) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObj) );
        // compute values for each node
        Aig_ManForEachNode( pAig, pObj, k )
        {
            Val0 = Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjFaninId0(pObj) );
            Val1 = Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjFaninId1(pObj) );
            if ( (Val0 ^ Aig_ObjFaninC0(pObj)) & (Val1 ^ Aig_ObjFaninC1(pObj)) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObj) );
        }
        // derive values for combinational outputs
        Aig_ManForEachCo( pAig, pObj, k )
        {
            Val0 = Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjFaninId0(pObj) );
            if ( Val0 ^ Aig_ObjFaninC0(pObj) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObj) );
        }
        if ( i == pCex->iFrame )
            continue;
        // transfer values to the register output of the next frame
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            if ( Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObjRi) ) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * (i+1) + Aig_ObjId(pObjRo) );
    }
    assert( iBit == pCex->nBits );
    // check that the counter-example is correct, that is, the corresponding output is asserted
    assert( Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * pCex->iFrame + Aig_ObjId(Aig_ManCo(pAig, pCex->iPo)) ) );
}